

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall
cmState::AddBuiltinCommand
          (cmState *this,string *name,
          unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *command)

{
  cmLegacyCommandWrapper local_40;
  _Head_base<0UL,_cmCommand_*,_false> local_38;
  Command local_30;
  
  local_38._M_head_impl =
       (command->_M_t).super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  (command->_M_t).super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl = (cmCommand *)0x0;
  cmLegacyCommandWrapper::cmLegacyCommandWrapper
            (&local_40,(unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)&local_38);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<cmLegacyCommandWrapper,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_30,&local_40);
  AddBuiltinCommand(this,name,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  if (local_40.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
      super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl !=
      (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0) {
    (**(code **)(*(long *)local_40.Command._M_t.
                          super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                          super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                          super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl + 8))();
  }
  local_40.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0;
  if (local_38._M_head_impl != (cmCommand *)0x0) {
    (*(local_38._M_head_impl)->_vptr_cmCommand[1])();
  }
  return;
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name,
                                std::unique_ptr<cmCommand> command)
{
  this->AddBuiltinCommand(name, cmLegacyCommandWrapper(std::move(command)));
}